

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicstransform.cpp
# Opt level: O2

void QGraphicsScale::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 uVar1;
  QVector3D *point;
  undefined8 *puVar2;
  bool bVar3;
  undefined8 uVar4;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      originChanged((QGraphicsScale *)_o);
      return;
    case 1:
      xScaleChanged((QGraphicsScale *)_o);
      return;
    case 2:
      yScaleChanged((QGraphicsScale *)_o);
      return;
    case 3:
      zScaleChanged((QGraphicsScale *)_o);
      return;
    case 4:
      scaleChanged((QGraphicsScale *)_o);
      return;
    }
    break;
  case ReadProperty:
    if ((uint)_id < 4) {
      puVar2 = (undefined8 *)*_a;
      switch(_id) {
      case 0:
        uVar1 = *(undefined4 *)(*(long *)(_o + 8) + 0x88);
        *puVar2 = *(undefined8 *)(*(long *)(_o + 8) + 0x80);
        *(undefined4 *)(puVar2 + 1) = uVar1;
        return;
      case 1:
        uVar4 = *(undefined8 *)(*(long *)(_o + 8) + 0x90);
        break;
      case 2:
        uVar4 = *(undefined8 *)(*(long *)(_o + 8) + 0x98);
        break;
      case 3:
        uVar4 = *(undefined8 *)(*(long *)(_o + 8) + 0xa0);
      }
      *puVar2 = uVar4;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      point = (QVector3D *)*_a;
      switch(_id) {
      case 0:
        setOrigin((QGraphicsScale *)_o,point);
        return;
      case 1:
        setXScale((QGraphicsScale *)_o,*(qreal *)point->v);
        return;
      case 2:
        setYScale((QGraphicsScale *)_o,*(qreal *)point->v);
        return;
      case 3:
        setZScale((QGraphicsScale *)_o,*(qreal *)point->v);
        return;
      }
    }
    break;
  case IndexOfMethod:
    bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsScale::*)()>
                      ((QtMocHelpers *)_a,(void **)originChanged,0,0);
    if ((((!bVar3) &&
         (bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsScale::*)()>
                            ((QtMocHelpers *)_a,(void **)xScaleChanged,0,1), !bVar3)) &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsScale::*)()>
                           ((QtMocHelpers *)_a,(void **)yScaleChanged,0,2), !bVar3)) &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsScale::*)()>
                          ((QtMocHelpers *)_a,(void **)zScaleChanged,0,3), !bVar3)) {
      QtMocHelpers::indexOfMethod<void(QGraphicsScale::*)()>
                ((QtMocHelpers *)_a,(void **)scaleChanged,0,4);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsScale::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsScale *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->originChanged(); break;
        case 1: _t->xScaleChanged(); break;
        case 2: _t->yScaleChanged(); break;
        case 3: _t->zScaleChanged(); break;
        case 4: _t->scaleChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::originChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::xScaleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::yScaleChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::zScaleChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::scaleChanged, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVector3D*>(_v) = _t->origin(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->xScale(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->yScale(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->zScale(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrigin(*reinterpret_cast<QVector3D*>(_v)); break;
        case 1: _t->setXScale(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setYScale(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setZScale(*reinterpret_cast<qreal*>(_v)); break;
        default: break;
        }
    }
}